

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::copyAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  X509CertificateExtension *pXVar1;
  Data *pDVar2;
  bool bVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pXVar1 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             ptr;
    lVar4 = (this->
            super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
            size;
    do {
      pDVar2 = (b->oid).d.d;
      pXVar1[lVar4].oid.d.d = pDVar2;
      pXVar1[lVar4].oid.d.ptr = (b->oid).d.ptr;
      pXVar1[lVar4].oid.d.size = (b->oid).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->name).d.d;
      pXVar1[lVar4].name.d.d = pDVar2;
      pXVar1[lVar4].name.d.ptr = (b->name).d.ptr;
      pXVar1[lVar4].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVariant::QVariant(&pXVar1[lVar4].value,&b->value);
      bVar3 = b->supported;
      pXVar1[lVar4].critical = b->critical;
      pXVar1[lVar4].supported = bVar3;
      lVar4 = (this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
              size + 1;
      (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
      size = lVar4;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }